

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O3

SSL_SESSION * GetSessionCallback(SSL *ssl,uint8_t *data,int len,int *copy)

{
  pointer __p;
  TestState *pTVar1;
  SSL_SESSION *pSVar2;
  ssl_session_st *psVar3;
  
  pTVar1 = GetTestState(ssl);
  psVar3 = (pTVar1->session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
           _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
  if (psVar3 == (ssl_session_st *)0x0) {
    if ((pTVar1->pending_session)._M_t.
        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl != (ssl_session_st *)0x0) {
      pSVar2 = SSL_magic_pending_session_ptr();
      return pSVar2;
    }
    psVar3 = (SSL_SESSION *)0x0;
  }
  else {
    *copy = 0;
    (pTVar1->session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl = (ssl_session_st *)0x0;
  }
  return psVar3;
}

Assistant:

static SSL_SESSION *GetSessionCallback(SSL *ssl, const uint8_t *data, int len,
                                       int *copy) {
  TestState *async_state = GetTestState(ssl);
  if (async_state->session) {
    *copy = 0;
    return async_state->session.release();
  } else if (async_state->pending_session) {
    return SSL_magic_pending_session_ptr();
  } else {
    return NULL;
  }
}